

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::build_accel(PathTracer *this)

{
  Scene *this_00;
  FILE *pFVar1;
  bool bVar2;
  reference ppSVar3;
  size_type sVar4;
  size_type sVar5;
  BVHAccel *this_01;
  double dVar6;
  BVHNode *local_a8;
  Primitive **local_a0;
  Primitive **local_98;
  __normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
  local_90;
  __normal_iterator<CMU462::StaticScene::Primitive_**,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
  local_88;
  const_iterator local_80;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  local_68;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *local_50;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *obj_prims;
  SceneObject *obj;
  iterator __end1;
  iterator __begin1;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  *__range1;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  primitives;
  PathTracer *this_local;
  
  primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  fprintf(_stdout,"[PathTracer] Collecting primitives... ");
  fflush(_stdout);
  Timer::start(&this->timer);
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  vector((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *)&__range1);
  this_00 = this->scene;
  __end1 = std::
           vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
           ::begin(&this_00->objects);
  obj = (SceneObject *)
        std::
        vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
        ::end(&this_00->objects);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
                                *)&obj);
    if (!bVar2) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
              ::operator*(&__end1);
    obj_prims = (vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                 *)*ppSVar3;
    (*(code *)*(obj_prims->
               super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
               )._M_impl.super__Vector_impl_data._M_start)(&local_68);
    local_50 = &local_68;
    sVar4 = std::
            vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
            ::size((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                    *)&__range1);
    sVar5 = std::
            vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
            ::size(local_50);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::reserve((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
               *)&__range1,sVar4 + sVar5);
    local_88._M_current =
         (Primitive **)
         std::
         vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
         ::end((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                *)&__range1);
    __gnu_cxx::
    __normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>
    ::__normal_iterator<CMU462::StaticScene::Primitive**>
              ((__normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>
                *)&local_80,&local_88);
    local_90._M_current =
         (Primitive **)
         std::
         vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
         ::begin(local_50);
    local_98 = (Primitive **)
               std::
               vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
               ::end(local_50);
    local_a0 = (Primitive **)
               std::
               vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>
               ::
               insert<__gnu_cxx::__normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>,void>
                         ((vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>
                           *)&__range1,local_80,local_90,
                          (__normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
                           )local_98);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::~vector(&local_68);
    __gnu_cxx::
    __normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
    ::operator++(&__end1);
  }
  Timer::stop(&this->timer);
  pFVar1 = _stdout;
  dVar6 = Timer::duration(&this->timer);
  fprintf(pFVar1,"Done! (%.4f sec)\n",dVar6);
  fprintf(_stdout,"[PathTracer] Building BVH... ");
  fflush(_stdout);
  Timer::start(&this->timer);
  this_01 = (BVHAccel *)operator_new(0x28);
  StaticScene::BVHAccel::BVHAccel
            (this_01,(vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                      *)&__range1,4);
  this->bvh = this_01;
  Timer::stop(&this->timer);
  pFVar1 = _stdout;
  dVar6 = Timer::duration(&this->timer);
  fprintf(pFVar1,"Done! (%.4f sec)\n",dVar6);
  local_a8 = StaticScene::BVHAccel::get_root(this->bvh);
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::push(&this->selectionHistory,&local_a8);
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  ~vector((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
           *)&__range1);
  return;
}

Assistant:

void PathTracer::build_accel() {

    // collect primitives //
    fprintf(stdout, "[PathTracer] Collecting primitives... "); fflush(stdout);
    timer.start();
    vector<Primitive *> primitives;
    for (SceneObject *obj : scene->objects) {
      const vector<Primitive *> &obj_prims = obj->get_primitives();
      primitives.reserve(primitives.size() + obj_prims.size());
      primitives.insert(primitives.end(), obj_prims.begin(), obj_prims.end());
    }
    timer.stop();
    fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

    // build BVH //
    fprintf(stdout, "[PathTracer] Building BVH... "); fflush(stdout);
    timer.start();
    bvh = new BVHAccel(primitives);
    timer.stop();
    fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

    // initial visualization //
    selectionHistory.push(bvh->get_root());
  }